

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O2

int comex_finalize(void)

{
  if (initialized == '\x01') {
    initialized = '\0';
    comex_barrier(0);
    comex_group_finalize();
    free(fence_array);
    MPI_Comm_free(&l_state);
  }
  return 0;
}

Assistant:

int comex_finalize()
{
    /* it's okay to call multiple times -- extra calls are no-ops */
    if (!initialized) {
        return COMEX_SUCCESS;
    }

    initialized = 0;

    /* Make sure that all outstanding operations are done */
    comex_barrier(COMEX_GROUP_WORLD);

    /* groups */
    comex_group_finalize();

    free(fence_array);

    /* destroy the communicators */
    MPI_Comm_free(&l_state.world_comm);

    return COMEX_SUCCESS;
}